

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3HashInsert(Hash *pH,char *pKey,void *data)

{
  uint *puVar1;
  _ht *p_Var2;
  HashElem *pHVar3;
  HashElem *pHVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  HashElem *pHVar8;
  _ht *p_Var9;
  HashElem *pHVar10;
  void *pvVar11;
  uint h;
  HashElem *local_38;
  
  pHVar8 = findElementWithHash(pH,pKey,&h);
  pvVar11 = pHVar8->data;
  if (pvVar11 == (void *)0x0) {
    if (data != (void *)0x0) {
      pHVar8 = (HashElem *)sqlite3Malloc(0x20);
      if (pHVar8 == (HashElem *)0x0) {
        return data;
      }
      pHVar8->pKey = pKey;
      pHVar8->data = data;
      uVar5 = pH->count + 1;
      pH->count = uVar5;
      if ((9 < uVar5) && (pH->htsize * 2 < uVar5)) {
        uVar7 = 0x40;
        if (uVar5 * 2 < 0x40) {
          uVar7 = uVar5 * 2;
        }
        if (uVar7 != pH->htsize) {
          if (sqlite3Hooks_0 != (code *)0x0) {
            (*sqlite3Hooks_0)();
          }
          p_Var9 = (_ht *)sqlite3Malloc((ulong)(uVar7 << 4));
          if (sqlite3Hooks_1 != (code *)0x0) {
            (*sqlite3Hooks_1)();
          }
          if (p_Var9 != (_ht *)0x0) {
            local_38 = pHVar8;
            sqlite3_free(pH->ht);
            pH->ht = p_Var9;
            iVar6 = (*sqlite3Config.m.xSize)(p_Var9);
            uVar5 = iVar6 >> 4;
            pH->htsize = uVar5;
            memset(p_Var9,0,(ulong)uVar5 << 4);
            pHVar8 = pH->first;
            pH->first = (HashElem *)0x0;
            while (pHVar8 != (HashElem *)0x0) {
              uVar7 = strHash(pHVar8->pKey);
              pHVar3 = pHVar8->next;
              insertElement(pH,p_Var9 + (ulong)uVar7 % (ulong)uVar5,pHVar8);
              pHVar8 = pHVar3;
            }
            uVar5 = strHash(pKey);
            h = uVar5 % pH->htsize;
            pHVar8 = local_38;
          }
        }
      }
      p_Var9 = pH->ht + h;
      if (pH->ht == (_ht *)0x0) {
        p_Var9 = (_ht *)0x0;
      }
      insertElement(pH,p_Var9,pHVar8);
    }
    pvVar11 = (void *)0x0;
  }
  else if (data == (void *)0x0) {
    pHVar3 = pHVar8->next;
    pHVar4 = pHVar8->prev;
    pHVar10 = (HashElem *)&pH->first;
    if (pHVar4 != (HashElem *)0x0) {
      pHVar10 = pHVar4;
    }
    pHVar10->next = pHVar3;
    if (pHVar3 != (HashElem *)0x0) {
      pHVar3->prev = pHVar4;
    }
    p_Var9 = pH->ht;
    if (p_Var9 != (_ht *)0x0) {
      p_Var2 = p_Var9 + h;
      if (p_Var9[h].chain == pHVar8) {
        p_Var2->chain = pHVar3;
      }
      p_Var2->count = p_Var2->count - 1;
    }
    sqlite3_free(pHVar8);
    puVar1 = &pH->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      sqlite3HashClear(pH);
    }
  }
  else {
    pHVar8->data = data;
    pHVar8->pKey = pKey;
  }
  return pvVar11;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HashInsert(Hash *pH, const char *pKey, void *data){
  unsigned int h;       /* the hash of the key modulo hash table size */
  HashElem *elem;       /* Used to loop thru the element list */
  HashElem *new_elem;   /* New element added to the pH */

  assert( pH!=0 );
  assert( pKey!=0 );
  elem = findElementWithHash(pH,pKey,&h);
  if( elem->data ){
    void *old_data = elem->data;
    if( data==0 ){
      removeElementGivenHash(pH,elem,h);
    }else{
      elem->data = data;
      elem->pKey = pKey;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  new_elem = (HashElem*)sqlite3Malloc( sizeof(HashElem) );
  if( new_elem==0 ) return data;
  new_elem->pKey = pKey;
  new_elem->data = data;
  pH->count++;
  if( pH->count>=10 && pH->count > 2*pH->htsize ){
    if( rehash(pH, pH->count*2) ){
      assert( pH->htsize>0 );
      h = strHash(pKey) % pH->htsize;
    }
  }
  insertElement(pH, pH->ht ? &pH->ht[h] : 0, new_elem);
  return 0;
}